

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall MidiInAlsa::openVirtualPort(MidiInAlsa *this,string *portName)

{
  undefined8 *puVar1;
  pointer pcVar2;
  pthread_t __thread1;
  pthread_t __thread2;
  undefined8 uVar3;
  ulong uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 uVar7;
  long lVar8;
  size_t __n;
  undefined1 *__s;
  string *psVar9;
  ulong uStack_b0;
  undefined1 local_a8 [8];
  pthread_attr_t attr;
  string local_50;
  
  __s = local_a8;
  puVar1 = (undefined8 *)(this->super_MidiInApi).super_MidiApi.apiData_;
  if (*(int *)((long)puVar1 + 0xc) < 0) {
    uStack_b0 = 0x10cfef;
    lVar8 = snd_seq_port_info_sizeof();
    lVar8 = -(lVar8 + 0xfU & 0xfffffffffffffff0);
    __s = local_a8 + lVar8;
    *(undefined8 *)(local_a8 + lVar8 + -8) = 0x10d005;
    __n = snd_seq_port_info_sizeof();
    *(undefined8 *)(local_a8 + lVar8 + -8) = 0x10d012;
    memset(__s,0,__n);
    *(undefined8 *)(local_a8 + lVar8 + -8) = 0x42;
    uVar3 = *(undefined8 *)(local_a8 + lVar8 + -8);
    *(undefined8 *)(local_a8 + lVar8 + -8) = 0x10d01d;
    snd_seq_port_info_set_capability(__s,uVar3);
    *(undefined8 *)(local_a8 + lVar8 + -8) = 0x10d02a;
    snd_seq_port_info_set_type(__s,0x100002);
    *(undefined8 *)(local_a8 + lVar8 + -8) = 0x10;
    uVar3 = *(undefined8 *)(local_a8 + lVar8 + -8);
    *(undefined8 *)(local_a8 + lVar8 + -8) = 0x10d035;
    snd_seq_port_info_set_midi_channels(__s,uVar3);
    *(undefined8 *)(local_a8 + lVar8 + -8) = 1;
    uVar4 = *(ulong *)(local_a8 + lVar8 + -8);
    *(undefined8 *)(local_a8 + lVar8 + -8) = 0x10d044;
    snd_seq_port_info_set_timestamping(__s,uVar4 & 0xffffffff);
    *(undefined8 *)(local_a8 + lVar8 + -8) = 0x10d04f;
    snd_seq_port_info_set_timestamp_real(__s,uVar4 & 0xffffffff);
    uVar7 = *(undefined4 *)(puVar1 + 9);
    *(undefined8 *)(local_a8 + lVar8 + -8) = 0x10d05b;
    snd_seq_port_info_set_timestamp_queue(__s,uVar7);
    pcVar2 = (portName->_M_dataplus)._M_p;
    *(undefined8 *)(local_a8 + lVar8 + -8) = 0x10d066;
    snd_seq_port_info_set_name(__s,pcVar2);
    uVar3 = *puVar1;
    *(undefined8 *)(local_a8 + lVar8 + -8) = 0x10d072;
    iVar6 = snd_seq_create_port(uVar3,__s);
    *(int *)((long)puVar1 + 0xc) = iVar6;
    if (iVar6 < 0) {
      psVar9 = &(this->super_MidiInApi).super_MidiApi.errorString_;
      *(undefined8 *)(local_a8 + lVar8 + -8) = 0x10d19e;
      std::__cxx11::string::assign((char *)psVar9);
      *(undefined8 *)(local_a8 + lVar8 + -8) = 0x10d1ad;
      std::__cxx11::string::string((string *)(attr.__size + 0x30),(string *)psVar9);
      *(undefined8 *)(local_a8 + lVar8 + -8) = 8;
      uVar3 = *(undefined8 *)(local_a8 + lVar8 + -8);
      *(undefined8 *)(local_a8 + lVar8 + -8) = 0x10d1bb;
      MidiApi::error((MidiApi *)this,(Type)uVar3,(string *)(attr.__size + 0x30));
      psVar9 = (string *)(attr.__size + 0x30);
      goto LAB_0010d1bf;
    }
    *(undefined8 *)(local_a8 + lVar8 + -8) = 0x10d086;
    uVar7 = snd_seq_port_info_get_port(__s);
    *(undefined4 *)((long)puVar1 + 0xc) = uVar7;
  }
  if ((this->super_MidiInApi).inputData_.doInput != false) {
    return;
  }
  __thread1 = puVar1[6];
  __thread2 = puVar1[7];
  *(undefined8 *)(__s + -8) = 0x10d0af;
  iVar6 = pthread_equal(__thread1,__thread2);
  if (iVar6 == 0) {
    *(undefined8 *)(__s + -8) = 0x10d0bd;
    pthread_join(__thread1,(void **)0x0);
  }
  uVar3 = *puVar1;
  uVar7 = *(undefined4 *)(puVar1 + 9);
  *(undefined8 *)(__s + -8) = 0x1e;
  uVar5 = *(undefined8 *)(__s + -8);
  *(undefined8 *)(__s + -8) = 0x10d0d2;
  snd_seq_control_queue(uVar3,uVar7,uVar5,0,0);
  uVar3 = *puVar1;
  *(undefined8 *)(__s + -8) = 0x10d0db;
  snd_seq_drain_output(uVar3);
  *(undefined8 *)(__s + -8) = 0x10d0ea;
  pthread_attr_init((pthread_attr_t *)local_a8);
  *(undefined8 *)(__s + -8) = 0x10d0f4;
  pthread_attr_setdetachstate((pthread_attr_t *)local_a8,0);
  *(undefined8 *)(__s + -8) = 0x10d0fe;
  pthread_attr_setschedpolicy((pthread_attr_t *)local_a8,0);
  (this->super_MidiInApi).inputData_.doInput = true;
  *(undefined8 *)(__s + -8) = 0x10d11a;
  iVar6 = pthread_create(puVar1 + 6,(pthread_attr_t *)local_a8,alsaMidiHandler,
                         &(this->super_MidiInApi).inputData_);
  *(undefined8 *)(__s + -8) = 0x10d125;
  pthread_attr_destroy((pthread_attr_t *)local_a8);
  if (iVar6 == 0) {
    return;
  }
  if (puVar1[2] != 0) {
    uVar3 = *puVar1;
    *(undefined8 *)(__s + -8) = 0x10d140;
    snd_seq_unsubscribe_port(uVar3);
    uVar3 = puVar1[2];
    *(undefined8 *)(__s + -8) = 0x10d149;
    snd_seq_port_subscribe_free(uVar3);
    puVar1[2] = 0;
  }
  (this->super_MidiInApi).inputData_.doInput = false;
  psVar9 = &(this->super_MidiInApi).super_MidiApi.errorString_;
  *(undefined8 *)(__s + -8) = 0x10d168;
  std::__cxx11::string::assign((char *)psVar9);
  *(undefined8 *)(__s + -8) = 0x10d177;
  std::__cxx11::string::string((string *)&local_50,(string *)psVar9);
  *(undefined8 *)(__s + -8) = 10;
  uVar3 = *(undefined8 *)(__s + -8);
  *(undefined8 *)(__s + -8) = 0x10d185;
  MidiApi::error((MidiApi *)this,(Type)uVar3,&local_50);
  psVar9 = &local_50;
LAB_0010d1bf:
  *(undefined8 *)(__s + -8) = 0x10d1c4;
  std::__cxx11::string::~string((string *)psVar9);
  return;
}

Assistant:

void MidiInAlsa :: openVirtualPort( const std::string &portName )
{
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( data->vport < 0 ) {
    snd_seq_port_info_t *pinfo;
    snd_seq_port_info_alloca( &pinfo );
    snd_seq_port_info_set_capability( pinfo,
                                      SND_SEQ_PORT_CAP_WRITE |
                                      SND_SEQ_PORT_CAP_SUBS_WRITE );
    snd_seq_port_info_set_type( pinfo,
                                SND_SEQ_PORT_TYPE_MIDI_GENERIC |
                                SND_SEQ_PORT_TYPE_APPLICATION );
    snd_seq_port_info_set_midi_channels( pinfo, 16 );
#ifndef AVOID_TIMESTAMPING
    snd_seq_port_info_set_timestamping( pinfo, 1 );
    snd_seq_port_info_set_timestamp_real( pinfo, 1 );
    snd_seq_port_info_set_timestamp_queue( pinfo, data->queue_id );
#endif
    snd_seq_port_info_set_name( pinfo, portName.c_str() );
    data->vport = snd_seq_create_port( data->seq, pinfo );

    if ( data->vport < 0 ) {
      errorString_ = "MidiInAlsa::openVirtualPort: ALSA error creating virtual port.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    data->vport = snd_seq_port_info_get_port( pinfo );
  }

  if ( inputData_.doInput == false ) {
    // Wait for old thread to stop, if still running
    if ( !pthread_equal( data->thread, data->dummy_thread_id ) )
      pthread_join( data->thread, NULL );

    // Start the input queue
#ifndef AVOID_TIMESTAMPING
    snd_seq_start_queue( data->seq, data->queue_id, NULL );
    snd_seq_drain_output( data->seq );
#endif
    // Start our MIDI input thread.
    pthread_attr_t attr;
    pthread_attr_init( &attr );
    pthread_attr_setdetachstate( &attr, PTHREAD_CREATE_JOINABLE );
    pthread_attr_setschedpolicy( &attr, SCHED_OTHER );

    inputData_.doInput = true;
    int err = pthread_create( &data->thread, &attr, alsaMidiHandler, &inputData_ );
    pthread_attr_destroy( &attr );
    if ( err ) {
      if ( data->subscription ) {
        snd_seq_unsubscribe_port( data->seq, data->subscription );
        snd_seq_port_subscribe_free( data->subscription );
        data->subscription = 0;
      }
      inputData_.doInput = false;
      errorString_ = "MidiInAlsa::openPort: error starting MIDI input thread!";
      error( RtMidiError::THREAD_ERROR, errorString_ );
      return;
    }
  }
}